

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
Bitmap_Operation::generateGrayScalePallete(void)

{
  pointer puVar1;
  pointer puVar2;
  uint8_t i;
  uchar uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  allocator_type local_a;
  value_type_conflict2 local_9;
  
  local_9 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_RDI,0x400,&local_9,&local_a)
  ;
  puVar1 = (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = '\0';
  for (puVar2 = (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 4) {
    *puVar2 = uVar3;
    puVar2[1] = uVar3;
    puVar2[2] = uVar3;
    uVar3 = uVar3 + '\x01';
  }
  return in_RDI;
}

Assistant:

std::vector< uint8_t > generateGrayScalePallete()
    {
        std::vector< uint8_t > pallete( 1024u, 0 );

        uint8_t * palleteData = pallete.data();
        uint8_t * palleteEnd = palleteData + pallete.size();

        for( uint8_t i = 0; palleteData != palleteEnd; ++i, ++palleteData ) {
            *palleteData++ = i;
            *palleteData++ = i;
            *palleteData++ = i;
        }

        return pallete;
    }